

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
mxx::allgather<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,uint *data,
          size_t size,comm *comm)

{
  int iVar1;
  reference out;
  comm *comm_local;
  size_t size_local;
  uint *data_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  iVar1 = mxx::comm::size(comm);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,size * (long)iVar1);
  out = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (__return_storage_ptr__,0);
  allgather<unsigned_int>(data,size,out,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgather(const T* data, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    result.resize(size*comm.size());
    allgather(data, size, &result[0], comm);
    return result;
}